

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseUnary(Parser *this)

{
  Mark MVar1;
  Mark *pMVar2;
  Token *pTVar3;
  pointer *__ptr;
  Tokenizer *in_RSI;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_00;
  UnaryOperator op;
  Token token;
  undefined1 local_a8 [24];
  undefined1 local_90 [56];
  Token local_58;
  
  pMVar2 = Stream::getMark(&in_RSI->stream_);
  MVar1 = *pMVar2;
  pTVar3 = Tokenizer::peek(in_RSI);
  Token::Token((Token *)(local_a8 + 0x18),pTVar3);
  if ((local_90._0_4_ == 0x1e) || (local_90._0_4_ == 0xc)) {
    Tokenizer::nextToken(&local_58,in_RSI);
    this_00 = &local_58.value;
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)this_00);
    local_a8._12_4_ = unaryOperatorFromToken((Parser *)this_00,(Token *)(local_a8 + 0x18));
    parseTerm((Parser *)local_a8);
    std::
    make_unique<UnaryNode,UnaryOperator_const&,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
              ((UnaryOperator *)(local_a8 + 0x10),
               (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)(local_a8 + 0xc))
    ;
    *(Mark *)(local_a8._16_8_ + 8) = MVar1;
    (this->tokenizer_).stream_.is_ = (istream *)local_a8._16_8_;
    if ((istream *)local_a8._0_8_ != (istream *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  else {
    parseTerm(this);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_90 + 8));
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseUnary()
{
  const auto mark = tokenizer_.getMark();
  const auto token = tokenizer_.peek();
  if(token.type == TokenType::Minus || token.type == TokenType::BinaryNot)
  {
    tokenizer_.nextToken();
    const auto op = unaryOperatorFromToken(token);
    auto term = parseTerm();
    auto node = std::make_unique<UnaryNode>(op, std::move(term));
    node->setMark(mark);
    return node;
  }
  else
    return parseTerm();
}